

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
wabt::WastLexer::CreateBufferLexer(string_view filename,void *data,size_t size)

{
  tuple<wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_> this;
  Offset in_R8;
  __uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_40;
  string_view local_38;
  
  local_38.data_ = (char *)filename.size_;
  local_38.size_ = (size_type)data;
  this.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>)
       operator_new(0x18);
  LexerSource::LexerSource
            ((LexerSource *)
             this.
             super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
             super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,(void *)size,in_R8);
  local_40._M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
  .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl =
       (tuple<wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>)
       (tuple<wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>)
       this.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
            ((wabt *)filename.data_,
             (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)&local_40,
             &local_38);
  if ((_Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
      super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl != (LexerSource *)0x0) {
    operator_delete((void *)local_40._M_t.
                            super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                            .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl);
  }
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (tuple<wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>)filename.data_;
}

Assistant:

std::unique_ptr<WastLexer> WastLexer::CreateBufferLexer(string_view filename,
                                                        const void* data,
                                                        size_t size) {
  return MakeUnique<WastLexer>(MakeUnique<LexerSource>(data, size), filename);
}